

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O2

string * __thiscall
Tuple::namedToString
          (string *__return_storage_ptr__,Tuple *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  size_t j;
  ulong uVar1;
  allocator local_31;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(this->data).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->data).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string Tuple::namedToString(vector<string>& names)
{
  string res = "";
  for (size_t j = 0; j < data.size(); j++)
  {
   if (j)  res += " ";
   res += names[j];
   res += "=";
   res += data[j];
  }
  return res;
}